

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::EnumNextPrevMethod::~EnumNextPrevMethod(EnumNextPrevMethod *this)

{
  SystemSubroutine::~SystemSubroutine(&this->super_SystemSubroutine);
  operator_delete(this,0x40);
  return;
}

Assistant:

EnumNextPrevMethod(KnownSystemName knownNameId, bool next) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), next(next) {}